

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void mocker::nasm::printModule(Module *module,ostream *out)

{
  ostream *poVar1;
  shared_ptr<mocker::nasm::Directive> *extraout_RDX;
  shared_ptr<mocker::nasm::Directive> *directive;
  shared_ptr<mocker::nasm::Directive> *extraout_RDX_00;
  __node_base *p_Var2;
  nasm *this;
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  local_68;
  string local_50;
  
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::vector(&local_68,&module->directives);
  directive = extraout_RDX;
  for (this = (nasm *)local_68.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      this != (nasm *)local_68.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; this = this + 0x10) {
    fmtDirective_abi_cxx11_(&local_50,this,directive);
    poVar1 = std::operator<<(out,(string *)&local_50);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_50);
    directive = extraout_RDX_00;
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::~vector(&local_68);
  std::endl<char,std::char_traits<char>>(out);
  p_Var2 = &(module->sections)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    printSection((Section *)(p_Var2 + 5),out);
    std::endl<char,std::char_traits<char>>(out);
  }
  return;
}

Assistant:

void printModule(const Module &module, std::ostream &out) {
  for (auto &directive : module.getDirectives())
    out << fmtDirective(directive) << '\n';
  out << std::endl;

  for (auto &kv : module.getSections()) {
    printSection(kv.second, out);
    out << std::endl;
  }
}